

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_expression_move.hpp
# Opt level: O2

void __thiscall
optimization::global_expr_move::BlockOps::BlockOps(BlockOps *this,BasicBlk *blk,bool offset)

{
  _Rb_tree_header *p_Var1;
  Op op;
  pointer puVar2;
  int iVar3;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *pvVar4;
  size_type sVar5;
  __hashtable *__h;
  Inst *pIVar6;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  pointer puVar7;
  VarId addr;
  key_type local_120;
  Value local_110;
  Value local_f0;
  Op local_d0;
  pair<const_optimization::global_expr_move::Op,_mir::inst::VarId> local_88;
  
  (this->ops)._M_h._M_buckets = &(this->ops)._M_h._M_single_bucket;
  (this->ops)._M_h._M_bucket_count = 1;
  (this->ops)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ops)._M_h._M_element_count = 0;
  (this->ops)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->ops)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ops)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->loads)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->loads)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->loads)._M_t._M_impl.super__Rb_tree_header;
  (this->loads)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->loads)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->loads)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->stores)._M_t._M_impl.super__Rb_tree_header;
  (this->stores)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->stores)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->stores)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->stores)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->stores)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  puVar2 = (blk->inst).
           super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar7 = (blk->inst).
                super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar2; puVar7 = puVar7 + 1) {
    pIVar6 = (puVar7->_M_t).
             super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
             super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
             super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
    iVar3 = (*(pIVar6->super_Displayable)._vptr_Displayable[1])(pIVar6);
    if (iVar3 == 1) {
      if ((pIVar6->super_Displayable)._vptr_Displayable != (_func_int **)&PTR_display_001db058) {
        pIVar6 = (Inst *)0x0;
      }
      op = pIVar6[3].dest.id;
      mir::inst::Value::Value(&local_f0,(Value *)(pIVar6 + 1));
      mir::inst::Value::Value(&local_110,(Value *)&pIVar6[2].dest);
      Op::Op(&local_d0,op,&local_f0,&local_110);
      std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>::
      pair<optimization::global_expr_move::Op,_mir::inst::VarId_&,_true>
                (&local_88,&local_d0,&pIVar6->dest);
      std::
      _Hashtable<optimization::global_expr_move::Op,std::pair<optimization::global_expr_move::Op_const,mir::inst::VarId>,std::allocator<std::pair<optimization::global_expr_move::Op_const,mir::inst::VarId>>,std::__detail::_Select1st,std::equal_to<optimization::global_expr_move::Op>,optimization::global_expr_move::hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<optimization::global_expr_move::Op_const,mir::inst::VarId>>
                ((_Hashtable<optimization::global_expr_move::Op,std::pair<optimization::global_expr_move::Op_const,mir::inst::VarId>,std::allocator<std::pair<optimization::global_expr_move::Op_const,mir::inst::VarId>>,std::__detail::_Select1st,std::equal_to<optimization::global_expr_move::Op>,optimization::global_expr_move::hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)this,&local_88);
    }
    else if (offset) {
      iVar3 = (*(((puVar7->_M_t).
                  super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t
                  .super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->super_Displayable).
                _vptr_Displayable[1])();
      if (iVar3 == 3) {
        if ((pIVar6->super_Displayable)._vptr_Displayable != (_func_int **)&PTR_display_001db238) {
          pIVar6 = (Inst *)0x0;
        }
        pvVar4 = std::get<1ul,int,mir::inst::VarId>
                           ((variant<int,_mir::inst::VarId> *)&pIVar6[1].dest);
        local_120.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
        local_120.id = pvVar4->id;
        sVar5 = std::
                set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                ::count(&this->stores,&local_120);
        if (sVar5 == 0) {
          std::pair<mir::inst::VarId,_mir::inst::Value>::
          pair<mir::inst::VarId_&,_mir::inst::Value_&,_true>
                    ((pair<mir::inst::VarId,_mir::inst::Value> *)&local_d0,&local_120,
                     (Value *)&pIVar6[2].dest);
          std::pair<const_std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>::
          pair<mir::inst::VarId_&,_true>
                    ((pair<const_std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId> *)
                     &local_88,(pair<mir::inst::VarId,_mir::inst::Value> *)&local_d0,&pIVar6->dest);
          std::
          _Rb_tree<std::pair<mir::inst::VarId,mir::inst::Value>,std::pair<std::pair<mir::inst::VarId,mir::inst::Value>const,mir::inst::VarId>,std::_Select1st<std::pair<std::pair<mir::inst::VarId,mir::inst::Value>const,mir::inst::VarId>>,std::less<std::pair<mir::inst::VarId,mir::inst::Value>>,std::allocator<std::pair<std::pair<mir::inst::VarId,mir::inst::Value>const,mir::inst::VarId>>>
          ::
          _M_insert_unique<std::pair<std::pair<mir::inst::VarId,mir::inst::Value>const,mir::inst::VarId>>
                    ((_Rb_tree<std::pair<mir::inst::VarId,mir::inst::Value>,std::pair<std::pair<mir::inst::VarId,mir::inst::Value>const,mir::inst::VarId>,std::_Select1st<std::pair<std::pair<mir::inst::VarId,mir::inst::Value>const,mir::inst::VarId>>,std::less<std::pair<mir::inst::VarId,mir::inst::Value>>,std::allocator<std::pair<std::pair<mir::inst::VarId,mir::inst::Value>const,mir::inst::VarId>>>
                      *)&this->loads,
                     (pair<const_std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId> *)
                     &local_88);
        }
      }
      else {
        iVar3 = (*(((puVar7->_M_t).
                    super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                    .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                  super_Displayable)._vptr_Displayable[1])();
        if (iVar3 == 4) {
          std::
          _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
          ::_M_insert_unique<mir::inst::VarId_const&>
                    ((_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                      *)&this->stores,&pIVar6->dest);
        }
      }
    }
  }
  return;
}

Assistant:

BlockOps(mir::inst::BasicBlk& blk, bool offset = false) {
    for (auto& inst : blk.inst) {
      auto& i = *inst;
      if (inst->inst_kind() == mir::inst::InstKind::Op) {
        auto opInst = dynamic_cast<mir::inst::OpInst*>(&i);
        ops.insert({Op(opInst->op, opInst->lhs, opInst->rhs), opInst->dest});
      } else if (offset) {
        if (inst->inst_kind() == mir::inst::InstKind::Load) {
          auto loadInst = dynamic_cast<mir::inst::LoadOffsetInst*>(&i);
          auto addr = std::get<mir::inst::VarId>(loadInst->src);
          if (stores.count(addr)) {
            continue;
          }
          loads.insert({{addr, loadInst->offset}, loadInst->dest});
        } else if (inst->inst_kind() == mir::inst::InstKind::Store) {
          auto storeInst = dynamic_cast<mir::inst::StoreOffsetInst*>(&i);
          stores.insert(storeInst->dest);
        }
      }
    }
  }